

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O3

void do_inproc_thr(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  int local_68;
  int local_64;
  inproc_args ia;
  nng_thread *thr;
  char *arg;
  int local_38;
  int local_34;
  int optidx;
  int val;
  
  local_38 = 0;
  iVar1 = nng_args_parse(argc,argv,opts,&local_34,(char **)&thr,&local_38);
  if (iVar1 == 0) {
    arg = "inproc://throughput-test";
    do {
      switch(local_34) {
      case 1:
        open_server = nng_pair0_open;
        open_client = nng_pair0_open;
        break;
      case 2:
        open_server = nng_pair1_open;
        open_client = nng_pair1_open;
        break;
      default:
        pcVar3 = "bad option";
        goto LAB_00101950;
      case 5:
        open_client = nng_pull0_open;
        open_server = nng_push0_open;
        break;
      case 8:
        arg = (char *)thr;
      }
      iVar1 = nng_args_parse(argc,argv,opts,&local_34,(char **)&thr,&local_38);
    } while (iVar1 == 0);
  }
  else {
    arg = "inproc://throughput-test";
  }
  pcVar3 = arg;
  lVar4 = (long)local_38;
  if (argc - local_38 == 2) {
    ia._0_8_ = arg;
    local_64 = parse_int(argv[lVar4],"message size");
    local_68 = parse_int(argv[lVar4 + 1],"count");
    ia.addr = (char *)throughput_server;
    iVar1 = nng_thread_create(&ia.func,do_inproc,&local_68);
    if (iVar1 == 0) {
      nng_msleep(100);
      throughput_client(pcVar3,(long)local_64,local_68);
      nng_thread_destroy(ia.func);
      return;
    }
    uVar2 = nng_strerror(iVar1);
    die("Cannot create thread: %s",uVar2);
  }
  pcVar3 = "Usage: inproc_thr <msg-size> <count>";
LAB_00101950:
  die(pcVar3);
}

Assistant:

void
do_inproc_thr(int argc, char **argv)
{
	nng_thread        *thr;
	struct inproc_args ia;
	int                rv;
	int                optidx;
	int                val;
	char              *arg;
	char              *addr = "inproc://throughput-test";

	optidx = 0;
	while ((rv = nng_args_parse(argc, argv, opts, &val, &arg, &optidx)) ==
	    0) {
		switch (val) {
#if 0
		// For now these protocols simply do not work with
		// throughput -- they don't work with backpressure properly.
		// In the future we should support synchronizing in the same
		// process, and alerting the sender both on completion of
		// a single message, and on completion of all messages.
		case OPT_REQREP0:
			open_client = nng_req0_open;
			open_server = nng_rep0_open;
			break;
#endif
		case OPT_PAIR0:
			open_client = nng_pair0_open;
			open_server = nng_pair0_open;
			break;
		case OPT_PAIR1:
			open_client = nng_pair1_open;
			open_server = nng_pair1_open;
			break;
		case OPT_PIPELINE0:
			open_client = nng_pull0_open;
			open_server = nng_push0_open;
			break;
		case OPT_URL:
			addr = arg;
			break;
		default:
			die("bad option");
		}
	}
	argc -= optidx;
	argv += optidx;

	if (argc != 2) {
		die("Usage: inproc_thr <msg-size> <count>");
	}

	ia.addr    = addr;
	ia.msgsize = parse_int(argv[0], "message size");
	ia.count   = parse_int(argv[1], "count");
	ia.func    = throughput_server;

	if ((rv = nng_thread_create(&thr, do_inproc, &ia)) != 0) {
		die("Cannot create thread: %s", nng_strerror(rv));
	}

	// Sleep a bit.
	nng_msleep(100);

	throughput_client(addr, ia.msgsize, ia.count);
	nng_thread_destroy(thr);
}